

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::SetUp
          (CommandLineInterfaceTest *this)

{
  tuple<google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  tVar1;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  __uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_98;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_90;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_88;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_80;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_78;
  string local_70;
  string local_50;
  string local_30;
  
  setenv("TEST_CASE",anon_var_dwarf_651463 + 5,1);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[15]>
            ((char (*) [15])&local_78);
  this->mock_generator_ = (MockCodeGenerator *)local_78._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"--test_out",&local_9b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"--test_opt",&local_9a);
  local_80._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (CodeGenerator *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Test output.",&local_99);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_50,&local_70,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_80,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((MockCodeGenerator *)local_80._M_head_impl != (MockCodeGenerator *)0x0) {
    (*((CodeGenerator *)&(local_80._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_80._M_head_impl = (CodeGenerator *)0x0;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"-t",&local_9b);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[15]>
            ((char (*) [15])&local_30);
  local_88._M_head_impl = (CodeGenerator *)local_30._M_dataplus._M_p;
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Test output.",&local_9a);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_50,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_88,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_88._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_88._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  local_88._M_head_impl = (CodeGenerator *)0x0;
  if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"--alt_out",&local_9b);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[14]>
            ((char (*) [14])&local_30);
  local_90._M_head_impl = (CodeGenerator *)local_30._M_dataplus._M_p;
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Alt output.",&local_9a);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_50,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_90._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_90._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  local_90._M_head_impl = (CodeGenerator *)0x0;
  if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&local_50);
  tVar1.
  super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
        )operator_new(0x30);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
   .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl =
       &PTR__NullCodeGenerator_01644530;
  *(bool *)((long)tVar1.
                  super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
                  .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>.
                  _M_head_impl + 8) = false;
  (((string *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl +
   0x10))->_M_dataplus)._M_p =
       (pointer)((long)tVar1.
                       super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
                       .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>.
                       _M_head_impl + 0x20);
  *(size_type *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl +
   0x18) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)tVar1.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
      + 0x20))->_M_local_buf[0] = '\0';
  this->null_generator_ =
       (NullCodeGenerator *)
       tVar1.
       super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
       .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"--null_out",(allocator<char> *)&local_30);
  local_98._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl =
       (tuple<google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
        )(tuple<google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
          )tVar1.
           super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
           .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Null output.",&local_9b);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_50,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_98,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_98._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
       )0x0) {
    (**(code **)(*(long *)local_98._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
                          .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>
                          ._M_head_impl + 8))();
  }
  local_98._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl =
       (tuple<google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
        )(_Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_50);
  if (local_78._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_78._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  return;
}

Assistant:

void CommandLineInterfaceTest::SetUp() {
  // Reset the mock generator's test case environment variable.
  SetMockGeneratorTestCase("");

  // Register generators.
  auto mock_generator = std::make_unique<MockCodeGenerator>("test_generator");
  mock_generator_ = mock_generator.get();
  RegisterGenerator("--test_out", "--test_opt", std::move(mock_generator),
                    "Test output.");
  RegisterGenerator("-t", std::make_unique<MockCodeGenerator>("test_generator"),
                    "Test output.");

  RegisterGenerator("--alt_out",
                    std::make_unique<MockCodeGenerator>("alt_generator"),
                    "Alt output.");

  auto null_generator = std::make_unique<NullCodeGenerator>();
  null_generator_ = null_generator.get();
  RegisterGenerator("--null_out", std::move(null_generator), "Null output.");

}